

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O1

int quicly_sentmap_prepare
              (quicly_sentmap_t *map,uint64_t packet_number,int64_t now,uint8_t ack_epoch)

{
  int iVar1;
  st_quicly_sent_block_t *psVar2;
  quicly_sent_t *pqVar3;
  
  if (map->_pending_packet != (quicly_sent_t *)0x0) {
    __assert_fail("map->_pending_packet == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sentmap.c"
                  ,0x61,"int quicly_sentmap_prepare(quicly_sentmap_t *, uint64_t, int64_t, uint8_t)"
                 );
  }
  psVar2 = map->tail;
  if ((psVar2 == (st_quicly_sent_block_t *)0x0) || (psVar2->next_insert_at == 0x10)) {
    psVar2 = quicly_sentmap__new_block(map);
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      pqVar3 = (quicly_sent_t *)0x0;
      goto LAB_00129b60;
    }
  }
  pqVar3 = psVar2->entries + psVar2->next_insert_at;
  psVar2->num_entries = psVar2->num_entries + 1;
  psVar2->next_insert_at = psVar2->next_insert_at + 1;
  pqVar3->acked = quicly_sentmap__type_packet;
LAB_00129b60:
  map->_pending_packet = pqVar3;
  if (pqVar3 == (quicly_sent_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    (pqVar3->data).packet.packet_number = packet_number;
    (pqVar3->data).packet.sent_at = now;
    (pqVar3->data).packet.ack_epoch = ack_epoch;
    *(undefined1 *)((long)&pqVar3->data + 0x11) = 0;
    (pqVar3->data).packet.cc_bytes_in_flight = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int quicly_sentmap_prepare(quicly_sentmap_t *map, uint64_t packet_number, int64_t now, uint8_t ack_epoch)
{
    assert(map->_pending_packet == NULL);

    if ((map->_pending_packet = quicly_sentmap_allocate(map, quicly_sentmap__type_packet)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    map->_pending_packet->data.packet = (quicly_sent_packet_t){packet_number, now, ack_epoch};
    return 0;
}